

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

void mk_disj(dtree_node_t *node,uint32 clust,comp_quest_t *q,quest_t *conj,uint32 c_idx,
            uint32 *d_idx)

{
  uint uVar1;
  int32 *piVar2;
  uint32 uVar3;
  undefined4 uVar4;
  quest_t *pqVar5;
  quest_t *pqVar6;
  quest_t *qu;
  uint32 d;
  uint32 i;
  uint32 *d_idx_local;
  uint32 c_idx_local;
  quest_t *conj_local;
  comp_quest_t *q_local;
  uint32 clust_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    if (node->clust == clust) {
      uVar1 = *d_idx;
      q->prod_len[uVar1] = c_idx;
      pqVar5 = (quest_t *)
               __ckd_calloc__((ulong)c_idx,0x20,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                              ,0x196);
      q->conj_q[uVar1] = pqVar5;
      for (qu._4_4_ = 0; qu._4_4_ < c_idx; qu._4_4_ = qu._4_4_ + 1) {
        pqVar5 = q->conj_q[uVar1] + qu._4_4_;
        pqVar6 = conj + qu._4_4_;
        uVar3 = pqVar6->neg;
        pqVar5->ctxt = pqVar6->ctxt;
        pqVar5->neg = uVar3;
        uVar4 = *(undefined4 *)&pqVar6->field_0xc;
        pqVar5->pset = pqVar6->pset;
        *(undefined4 *)&pqVar5->field_0xc = uVar4;
        pqVar5->member = pqVar6->member;
        pqVar5->posn = pqVar6->posn;
      }
      *d_idx = *d_idx + 1;
    }
  }
  else {
    piVar2 = (int32 *)node->q;
    conj[c_idx].ctxt = *piVar2;
    conj[c_idx].neg = piVar2[1];
    conj[c_idx].pset = piVar2[2];
    conj[c_idx].member = *(uint32 **)(piVar2 + 4);
    conj[c_idx].posn = *(uint32 **)(piVar2 + 6);
    mk_disj(node->y,clust,q,conj,c_idx + 1,d_idx);
    conj[c_idx].neg = (uint)((conj[c_idx].neg != 0 ^ 0xffU) & 1);
    mk_disj(node->n,clust,q,conj,c_idx + 1,d_idx);
  }
  return;
}

Assistant:

void
mk_disj(dtree_node_t *node,
	uint32 clust,
	comp_quest_t *q,
	quest_t *conj,
	uint32 c_idx,
	uint32 *d_idx)
{
    if (IS_LEAF(node)) {
	if (node->clust == clust) {
	    uint32 i;
	    uint32 d;

	    d = *d_idx;
	    q->prod_len[d] = c_idx;
	    q->conj_q[d] = (quest_t *)ckd_calloc(c_idx, sizeof(quest_t));
	    for (i = 0; i < c_idx; i++) {
		memcpy(&q->conj_q[d][i], &conj[i], sizeof(quest_t));
	    }

	    ++(*d_idx);
	}
	else
	    return;
    }
    else {
	quest_t *qu;

	qu = (quest_t *)node->q;

	conj[c_idx].ctxt = qu->ctxt;
	conj[c_idx].neg  = qu->neg;
	conj[c_idx].pset = qu->pset;
	conj[c_idx].member = qu->member;
	conj[c_idx].posn = qu->posn;

	mk_disj(node->y, clust, q, conj, c_idx+1, d_idx);

	conj[c_idx].neg = !conj[c_idx].neg;
	mk_disj(node->n, clust, q, conj, c_idx+1, d_idx);

	return;
    }
}